

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O3

void file_lock(ang_file *f)

{
  int __fd;
  ushort local_28 [4];
  undefined8 local_20;
  undefined8 uStack_18;
  undefined4 local_10;
  
  local_28[0] = (ushort)(f->mode != MODE_READ);
  local_28[1] = 0;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = 0;
  __fd = fileno((FILE *)f->fh);
  fcntl(__fd,7,local_28);
  return;
}

Assistant:

void file_lock(ang_file *f)
{
#if defined(HAVE_FCNTL_H) && defined(UNIX)
	struct flock lock;
	lock.l_type = (f->mode == MODE_READ ? F_RDLCK : F_WRLCK);
	lock.l_whence = SEEK_SET;
	lock.l_start = 0;
	lock.l_len = 0;
	lock.l_pid = 0;
	fcntl(fileno(f->fh), F_SETLKW, &lock);
#endif /* HAVE_FCNTL_H && UNIX */
}